

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trianglemesh.hpp
# Opt level: O0

vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> * __thiscall
TriangleMesh::loadfromfile
          (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *__return_storage_ptr__,
          TriangleMesh *this,char *filename)

{
  pointer *ppvVar1;
  vector<vec2f,_std::allocator<vec2f>_> *this_00;
  pointer *this_01;
  vec2f vt1;
  vec2f vt2;
  vec2f vt3;
  vec3f v2;
  vec3f v3;
  vec3f vn1;
  vec3f vn2;
  vec3f vn3;
  byte bVar2;
  bool bVar3;
  int iVar4;
  _Ios_Openmode _Var5;
  size_t sVar6;
  undefined8 *puVar7;
  istream *piVar8;
  char *pcVar9;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  Triangle *this_02;
  reference pvVar13;
  reference ppBVar14;
  vec3f vVar15;
  Triangle *local_728;
  byte local_64e;
  Triangle *local_558;
  vec3f local_54c;
  vec3f local_540;
  vec3f local_530;
  vec3f local_520;
  vec3f local_510;
  vec3f local_500;
  vec3f local_4f0;
  vec3f local_4e4;
  value_type local_4d8;
  int local_4d0;
  int local_4cc;
  int ivn;
  int ivt;
  int iv;
  int i;
  int indices [3];
  bool recompute_normal;
  vector<vec2f,_std::allocator<vec2f>_> vvt;
  vector<vec3f,_std::allocator<vec3f>_> vvn;
  vector<vec3f,_std::allocator<vec3f>_> vv;
  vec3f t_2;
  vec2f t_1;
  vec3f t;
  string cmd;
  stringstream local_428 [8];
  stringstream in;
  string local_2a0 [8];
  string line;
  undefined1 local_280 [8];
  vector<vec2f,_std::allocator<vec2f>_> vt;
  vector<vec3f,_std::allocator<vec3f>_> vn;
  vector<vec3f,_std::allocator<vec3f>_> v;
  long local_228;
  ifstream fin;
  char *local_20;
  char *filename_local;
  TriangleMesh *this_local;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *faces;
  
  local_20 = filename;
  filename_local = (char *)this;
  this_local = (TriangleMesh *)__return_storage_ptr__;
  github111116::ConsoleLogger::log<char[14],char_const*>
            (&console,(char (*) [14])"Loading mesh:",&local_20);
  pcVar9 = local_20;
  sVar6 = strlen(local_20);
  iVar4 = strcmp(pcVar9 + (sVar6 - 4),".obj");
  if (iVar4 != 0) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = "format must be obj";
    __cxa_throw(puVar7,&char_const*::typeinfo,0);
  }
  std::ifstream::ifstream(&local_228,local_20,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar2 & 1) != 0) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = "Can\'t open file";
    __cxa_throw(puVar7,&char_const*::typeinfo,0);
  }
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector(__return_storage_ptr__);
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)
             &vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)
             &vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<vec2f,_std::allocator<vec2f>_>::vector
            ((vector<vec2f,_std::allocator<vec2f>_> *)local_280);
  std::__cxx11::string::string(local_2a0);
  do {
    do {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_228,local_2a0);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
      if (!bVar3) {
        std::__cxx11::string::~string(local_2a0);
        std::vector<vec2f,_std::allocator<vec2f>_>::~vector
                  ((vector<vec2f,_std::allocator<vec2f>_> *)local_280);
        std::vector<vec3f,_std::allocator<vec3f>_>::~vector
                  ((vector<vec3f,_std::allocator<vec3f>_> *)
                   &vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<vec3f,_std::allocator<vec3f>_>::~vector
                  ((vector<vec3f,_std::allocator<vec3f>_> *)
                   &vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::ifstream::~ifstream(&local_228);
        return __return_storage_ptr__;
      }
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_2a0);
      iVar4 = isalpha((int)*pcVar9);
    } while (iVar4 == 0);
    _Var5 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_428,local_2a0,_Var5);
    std::__cxx11::string::string((string *)&t.y);
    std::operator>>((istream *)local_428,(string *)&t.y);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &t.y,"v");
    if (bVar3) {
      vec3f::vec3f((vec3f *)&t_1);
      operator>>((istream *)local_428,(vec3f *)&t_1);
      std::vector<vec3f,_std::allocator<vec3f>_>::push_back
                ((vector<vec3f,_std::allocator<vec3f>_> *)
                 &vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type *)&t_1);
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &t.y,"vt");
    if (bVar3) {
      vec2f::vec2f((vec2f *)&t_2.y);
      operator>>((istream *)local_428,(vec2f *)&t_2.y);
      std::vector<vec2f,_std::allocator<vec2f>_>::push_back
                ((vector<vec2f,_std::allocator<vec2f>_> *)local_280,(value_type *)&t_2.y);
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &t.y,"vn");
    if (bVar3) {
      vec3f::vec3f((vec3f *)&vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
      operator>>((istream *)local_428,
                 (vec3f *)&vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      std::vector<vec3f,_std::allocator<vec3f>_>::push_back
                ((vector<vec3f,_std::allocator<vec3f>_> *)
                 &vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type *)
                 &vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &t.y,"f");
    if (bVar3) {
      std::vector<vec3f,_std::allocator<vec3f>_>::vector
                ((vector<vec3f,_std::allocator<vec3f>_> *)
                 &vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<vec3f,_std::allocator<vec3f>_>::vector
                ((vector<vec3f,_std::allocator<vec3f>_> *)
                 &vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<vec2f,_std::allocator<vec2f>_>::vector
                ((vector<vec2f,_std::allocator<vec2f>_> *)(indices + 2));
      indices[1]._3_1_ = false;
      while( true ) {
        bVar2 = std::ios::fail();
        local_64e = 0;
        if ((bVar2 & 1) == 0) {
          local_64e = std::ios::eof();
          local_64e = local_64e ^ 0xff;
        }
        if ((local_64e & 1) == 0) break;
        memset(&iv,0,0xc);
        for (ivt = 0; ivt < 3; ivt = ivt + 1) {
          iVar4 = std::istream::peek();
          if (iVar4 != 0x2f) {
            std::istream::operator>>(local_428,&iv + ivt);
          }
          iVar4 = std::istream::peek();
          if (iVar4 != 0x2f) break;
          std::istream::get();
        }
        while( true ) {
          iVar4 = std::istream::peek();
          iVar4 = isspace(iVar4);
          if (iVar4 == 0) break;
          std::istream::get();
        }
        if (iv == 0) {
          github111116::ConsoleLogger::log<char[10],std::__cxx11::string>
                    (&console,(char (*) [10])"Obj line:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0)
          ;
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = "error parsing obj";
          __cxa_throw(puVar7,&char_const*::typeinfo,0);
        }
        ivn = iv;
        local_4cc = i;
        local_4d0 = indices[0];
        if (iv < 0) {
          sVar10 = std::vector<vec3f,_std::allocator<vec3f>_>::size
                             ((vector<vec3f,_std::allocator<vec3f>_> *)
                              &vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          ivn = ivn + (int)sVar10 + 1;
        }
        if (local_4cc < 0) {
          sVar10 = std::vector<vec2f,_std::allocator<vec2f>_>::size
                             ((vector<vec2f,_std::allocator<vec2f>_> *)local_280);
          local_4cc = local_4cc + (int)sVar10 + 1;
        }
        if (local_4d0 < 0) {
          sVar10 = std::vector<vec3f,_std::allocator<vec3f>_>::size
                             ((vector<vec3f,_std::allocator<vec3f>_> *)
                              &vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          local_4d0 = local_4d0 + (int)sVar10 + 1;
        }
        pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                            ((vector<vec3f,_std::allocator<vec3f>_> *)
                             &vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)(ivn + -1));
        std::vector<vec3f,_std::allocator<vec3f>_>::push_back
                  ((vector<vec3f,_std::allocator<vec3f>_> *)
                   &vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pvVar11);
        if (local_4cc == 0) {
          vec2f::vec2f(&local_4d8);
        }
        else {
          pvVar13 = std::vector<vec2f,_std::allocator<vec2f>_>::operator[]
                              ((vector<vec2f,_std::allocator<vec2f>_> *)local_280,
                               (long)(local_4cc + -1));
          local_4d8 = *pvVar13;
        }
        std::vector<vec2f,_std::allocator<vec2f>_>::push_back
                  ((vector<vec2f,_std::allocator<vec2f>_> *)(indices + 2),&local_4d8);
        if (local_4d0 == 0) {
          vec3f::vec3f(&local_4e4,0.0,1.0,0.0);
        }
        else {
          pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                              ((vector<vec3f,_std::allocator<vec3f>_> *)
                               &vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)(local_4d0 + -1));
          local_4e4.x = pvVar11->x;
          local_4e4.y = pvVar11->y;
          local_4e4.z = pvVar11->z;
        }
        std::vector<vec3f,_std::allocator<vec3f>_>::push_back
                  ((vector<vec3f,_std::allocator<vec3f>_> *)
                   &vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_4e4);
        indices[1]._3_1_ = (indices[1]._3_1_ & 1) != 0 || local_4d0 == 0;
      }
      sVar10 = std::vector<vec3f,_std::allocator<vec3f>_>::size
                         ((vector<vec3f,_std::allocator<vec3f>_> *)
                          &vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      if (sVar10 != 3) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "mesh face other than triangle not supported";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      ppvVar1 = &vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                          ((vector<vec3f,_std::allocator<vec3f>_> *)ppvVar1,1);
      pvVar12 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                          ((vector<vec3f,_std::allocator<vec3f>_> *)ppvVar1,0);
      vVar15 = ::operator-(pvVar11,pvVar12);
      local_510.z = vVar15.z;
      local_510._0_8_ = vVar15._0_8_;
      ppvVar1 = &vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_500._0_8_ = local_510._0_8_;
      local_500.z = local_510.z;
      pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                          ((vector<vec3f,_std::allocator<vec3f>_> *)ppvVar1,2);
      pvVar12 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                          ((vector<vec3f,_std::allocator<vec3f>_> *)ppvVar1,0);
      vVar15 = ::operator-(pvVar11,pvVar12);
      local_530.z = vVar15.z;
      local_530._0_8_ = vVar15._0_8_;
      local_520._0_8_ = local_530._0_8_;
      local_520.z = local_530.z;
      vVar15 = cross(&local_500,&local_520);
      local_540.z = vVar15.z;
      local_540._0_8_ = vVar15._0_8_;
      local_4f0._0_8_ = local_540._0_8_;
      local_4f0.z = local_540.z;
      vec3f::vec3f(&local_54c,0.0);
      bVar3 = operator!=(&local_4f0,&local_54c);
      if (bVar3) {
        this_02 = (Triangle *)operator_new(0xa0);
        ppvVar1 = &vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                            ((vector<vec3f,_std::allocator<vec3f>_> *)ppvVar1,0);
        vVar15.x = pvVar11->x;
        vVar15.y = pvVar11->y;
        vVar15.z = pvVar11->z;
        pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                            ((vector<vec3f,_std::allocator<vec3f>_> *)ppvVar1,1);
        v2.x = pvVar11->x;
        v2.y = pvVar11->y;
        v2.z = pvVar11->z;
        pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                            ((vector<vec3f,_std::allocator<vec3f>_> *)ppvVar1,2);
        v3.x = pvVar11->x;
        v3.y = pvVar11->y;
        v3.z = pvVar11->z;
        this_00 = (vector<vec2f,_std::allocator<vec2f>_> *)(indices + 2);
        pvVar13 = std::vector<vec2f,_std::allocator<vec2f>_>::operator[](this_00,0);
        vt1.x = pvVar13->x;
        vt1.y = pvVar13->y;
        pvVar13 = std::vector<vec2f,_std::allocator<vec2f>_>::operator[](this_00,1);
        vt2.x = pvVar13->x;
        vt2.y = pvVar13->y;
        pvVar13 = std::vector<vec2f,_std::allocator<vec2f>_>::operator[](this_00,2);
        vt3.x = pvVar13->x;
        vt3.y = pvVar13->y;
        this_01 = &vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                            ((vector<vec3f,_std::allocator<vec3f>_> *)this_01,0);
        vn1.x = pvVar11->x;
        vn1.y = pvVar11->y;
        vn1.z = pvVar11->z;
        pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                            ((vector<vec3f,_std::allocator<vec3f>_> *)this_01,1);
        vn2.x = pvVar11->x;
        vn2.y = pvVar11->y;
        vn2.z = pvVar11->z;
        pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                            ((vector<vec3f,_std::allocator<vec3f>_> *)this_01,2);
        vn3.x = pvVar11->x;
        vn3.y = pvVar11->y;
        vn3.z = pvVar11->z;
        Triangle::Triangle(this_02,vVar15,v2,v3,vt1,vt2,vt3,vn1,vn2,vn3);
        local_558 = this_02;
        std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::push_back
                  (__return_storage_ptr__,(value_type *)&local_558);
        if ((indices[1]._3_1_ & 1) != 0) {
          ppBVar14 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::back
                               (__return_storage_ptr__);
          if (*ppBVar14 == (value_type)0x0) {
            local_728 = (Triangle *)0x0;
          }
          else {
            local_728 = (Triangle *)
                        __dynamic_cast(*ppBVar14,&BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
          }
          Triangle::recompute_normal(local_728);
        }
      }
      std::vector<vec2f,_std::allocator<vec2f>_>::~vector
                ((vector<vec2f,_std::allocator<vec2f>_> *)(indices + 2));
      std::vector<vec3f,_std::allocator<vec3f>_>::~vector
                ((vector<vec3f,_std::allocator<vec3f>_> *)
                 &vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<vec3f,_std::allocator<vec3f>_>::~vector
                ((vector<vec3f,_std::allocator<vec3f>_> *)
                 &vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    std::__cxx11::string::~string((string *)&t.y);
    std::__cxx11::stringstream::~stringstream(local_428);
  } while( true );
}

Assistant:

std::vector<BasicPrimitive*> loadfromfile(const char* filename)
	{
		console.log("Loading mesh:", filename);
		if (strcmp(filename+strlen(filename)-4, ".obj") != 0)
			throw "format must be obj";
		std::ifstream fin(filename);
		if (!fin)
			throw "Can't open file";
		std::vector<BasicPrimitive*> faces;
		std::vector<vec3f> v,vn;
		std::vector<vec2f> vt;
		std::string line;
		// reading file line by line
		while (std::getline(fin, line)) {
			if (isalpha(line[0])) {
				std::stringstream in(line);
				std::string cmd;
				in >> cmd;
				if (cmd == "v") { // vertex coordinate
					vec3f t;
					in >> t;
					v.push_back(t);
				}
				if (cmd == "vt") { // texture coordinate
					vec2f t;
					in >> t;
					vt.push_back(t);
				}
				if (cmd == "vn") { // normal vector
					vec3f t;
					in >> t;
					vn.push_back(t);
				}
				if (cmd == "f") { // polygon face
					std::vector<vec3f> vv, vvn;
					std::vector<vec2f> vvt;
					bool recompute_normal = false;
					while (!in.fail() && !in.eof()) {					
						// code from tungsten ObjLoader::loadFace
						int indices[] = {0, 0, 0};
						for (int i = 0; i < 3; ++i) {
							if (in.peek() != '/')
								in >> indices[i];
							if (in.peek() == '/')
								in.get();
							else
								break;
						}
						while (isspace(in.peek()))
							in.get();
						if (!indices[0]) {
							console.log("Obj line:", line);
							throw "error parsing obj";
						}
						int iv = indices[0];
						int ivt = indices[1];
						int ivn = indices[2];
						if (iv < 0) iv += v.size()+1;
						if (ivt < 0) ivt += vt.size()+1;
						if (ivn < 0) ivn += vn.size()+1;
						vv.push_back(v[iv-1]);
						vvt.push_back(ivt? vt[ivt-1]: vec2f());
						vvn.push_back(ivn? vn[ivn-1]: vec3f(0,1,0));
						recompute_normal |= !ivn;
					}
					if (vv.size() == 3) {
						// ignore triangles of zero surface area
						if (cross(vv[1]-vv[0],vv[2]-vv[0]) != vec3f(0)) {
							faces.push_back(new Triangle(vv[0], vv[1], vv[2], vvt[0], vvt[1], vvt[2], vvn[0], vvn[1], vvn[2]));
							if (recompute_normal)
								dynamic_cast<Triangle*>(faces.back())->recompute_normal();
						}
					}
					else {
						throw "mesh face other than triangle not supported";
					}
				} // end reading face
			}
		}
		return faces;
	}